

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O2

void __thiscall QtMWidgets::ToolBar::setOrientation(ToolBar *this,Orientation orientation)

{
  ToolBarPrivate *pTVar1;
  NavigationArrow *pNVar2;
  QSizePolicy type;
  
  if (((this->d).d)->layout->orient != orientation) {
    QObject::deleteLater();
    QObject::deleteLater();
    pNVar2 = (NavigationArrow *)operator_new(0x30);
    if (orientation == Vertical) {
      NavigationArrow::NavigationArrow(pNVar2,Top,&this->super_QWidget);
      ((this->d).d)->left = pNVar2;
      pNVar2 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar2,Bottom,&this->super_QWidget);
    }
    else {
      NavigationArrow::NavigationArrow(pNVar2,Left,&this->super_QWidget);
      ((this->d).d)->left = pNVar2;
      pNVar2 = (NavigationArrow *)operator_new(0x30);
      NavigationArrow::NavigationArrow(pNVar2,Right,&this->super_QWidget);
    }
    ((this->d).d)->right = pNVar2;
    type.field_0 = SUB84(this,0);
    QWidget::setSizePolicy(type);
    pTVar1 = (this->d).d;
    ToolBarLayout::setLeftArrow(pTVar1->layout,pTVar1->left);
    pTVar1 = (this->d).d;
    ToolBarLayout::setRightArrow(pTVar1->layout,pTVar1->right);
    QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
              ((Object *)&stack0xffffffffffffffd0,
               (offset_in_NavigationArrow_to_subr)((this->d).d)->left,
               (Object *)NavigationArrow::clicked,0,(ConnectionType)type.field_0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffd0);
    QObject::connect<void(QtMWidgets::NavigationArrow::*)(),void(QtMWidgets::ToolBar::*)()>
              ((Object *)&stack0xffffffffffffffc8,
               (offset_in_NavigationArrow_to_subr)((this->d).d)->right,
               (Object *)NavigationArrow::clicked,0,(ConnectionType)type.field_0);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
    ToolBarLayout::setOrientation(((this->d).d)->layout,orientation);
    QWidget::updateGeometry();
    orientationChanged(this,orientation);
  }
  return;
}

Assistant:

void
ToolButton::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			d->leftButtonPressed = false;
			d->action->trigger();
		}

		e->accept();
	}
	else
		e->ignore();
}